

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O2

UBool icu_63::compat_SyncMutableUTextContents(UText *ut)

{
  short sVar1;
  UnicodeString *this;
  UBool UVar2;
  int64_t iVar3;
  char16_t *pcVar4;
  int32_t iVar5;
  
  iVar3 = utext_nativeLength_63(ut);
  if (iVar3 == ut->nativeIndexingLimit) {
    UVar2 = '\0';
  }
  else {
    this = (UnicodeString *)ut->context;
    sVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar5 = (this->fUnion).fFields.fLength;
    }
    else {
      iVar5 = (int)sVar1 >> 5;
    }
    pcVar4 = UnicodeString::getBuffer(this);
    ut->chunkContents = pcVar4;
    ut->chunkLength = iVar5;
    ut->chunkNativeLimit = (long)iVar5;
    ut->nativeIndexingLimit = iVar5;
    UVar2 = '\x01';
  }
  return UVar2;
}

Assistant:

static UBool compat_SyncMutableUTextContents(UText *ut) {
    UBool retVal = FALSE;

    //  In the following test, we're really only interested in whether the UText should switch
    //  between heap and stack allocation.  If length hasn't changed, we won't, so the chunkContents
    //  will still point to the correct data.
    if (utext_nativeLength(ut) != ut->nativeIndexingLimit) {
        UnicodeString *us=(UnicodeString *)ut->context;

        // Update to the latest length.
        // For example, (utext_nativeLength(ut) != ut->nativeIndexingLimit).
        int32_t newLength = us->length();

        // Update the chunk description.
        // The buffer may have switched between stack- and heap-based.
        ut->chunkContents    = us->getBuffer();
        ut->chunkLength      = newLength;
        ut->chunkNativeLimit = newLength;
        ut->nativeIndexingLimit = newLength;
        retVal = TRUE;
    }

    return retVal;
}